

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::reconstructExpression_abi_cxx11_
          (ExpressionResultBuilder *this,AssertionInfo *info)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long in_RDX;
  string local_210 [32];
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  long local_20;
  AssertionInfo *info_local;
  ExpressionResultBuilder *this_local;
  
  local_20 = in_RDX;
  info_local = info;
  this_local = this;
  bVar1 = std::operator==(&info[1].lineInfo.file,"");
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     &info[1].lineInfo.file);
    }
    else {
      std::__cxx11::string::string((string *)this,(string *)(local_20 + 0x48));
    }
  }
  else {
    bVar1 = std::operator==(&info[1].lineInfo.file,"matches");
    if (bVar1) {
      std::operator+(local_40,&info->field_0x50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_40);
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      bVar1 = std::operator!=(&info[1].lineInfo.file,"!");
      if (bVar1) {
        lVar3 = std::__cxx11::string::size();
        lVar4 = std::__cxx11::string::size();
        if ((((ulong)(lVar3 + lVar4) < 0x28) &&
            (lVar3 = std::__cxx11::string::find(&info->field_0x50,0x1ba807), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)(info + 1),0x1ba807), lVar3 == -1)) {
          std::operator+(local_b0,&info->field_0x50);
          std::operator+(local_90,local_b0);
          std::operator+(local_70,(char *)local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         local_70);
          std::__cxx11::string::~string((string *)local_70);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)local_b0);
        }
        else {
          std::operator+(local_110,&info->field_0x50);
          std::operator+(local_f0,local_110);
          std::operator+(local_d0,(char *)local_f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         local_d0);
          std::__cxx11::string::~string((string *)local_d0);
          std::__cxx11::string::~string((string *)local_f0);
          std::__cxx11::string::~string((string *)local_110);
        }
      }
      else {
        std::operator+((char *)local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "{can\'t expand - use ");
        std::operator+(local_1d0,(char *)local_1f0);
        std::__cxx11::string::substr((ulong)local_210,local_20 + 0x48);
        std::operator+(local_1b0,local_1d0);
        std::operator+(local_190,(char *)local_1b0);
        std::operator+(local_170,local_190);
        std::operator+(local_150,(char *)local_170);
        std::operator+(local_130,local_150);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_130);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)local_190);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string(local_1f0);
      }
    }
  }
  return this;
}

Assistant:

std::string ExpressionResultBuilder::reconstructExpression( AssertionInfo const& info ) const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? info.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + info.macroName + "_FALSE( " + info.capturedExpression.substr(1) + " ) instead of " + info.macroName + "( " + info.capturedExpression + " ) for better diagnostics}";
    }